

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::static_getp_packBytes(vm_val_t *retval,uint *pargc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  CVmMemorySource *this;
  undefined8 *puVar5;
  long *plVar6;
  uint argc;
  err_frame_t err_cur__;
  
  if (pargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *pargc;
  }
  if (static_getp_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&static_getp_packBytes(vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      static_getp_packBytes::desc.min_argc_ = 1;
      static_getp_packBytes::desc.opt_argc_ = 0;
      static_getp_packBytes::desc.varargs_ = 1;
      __cxa_guard_release(&static_getp_packBytes(vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,pargc,&static_getp_packBytes::desc);
  if (iVar3 == 0) {
    this = (CVmMemorySource *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource(this,0);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      iVar3 = 0;
      CVmPack::pack(0,argc,(CVmDataSource *)this);
      vVar4 = create_latin1(iVar3,(CVmDataSource *)this);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar4;
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[1])(this);
    }
    peVar1 = err_cur__.prv_;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjString::static_getp_packBytes(VMG_ vm_val_t *retval, uint *pargc)
{
    /* check arguments */
    uint argc = (pargc != 0 ? *pargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, pargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a string from the byte stream */
        retval->set_obj(create_latin1(vmg_ FALSE, dst));
    }